

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteInstruction.cpp
# Opt level: O1

int do_mov(void)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  char *pcVar5;
  char *pcVar6;
  vm_register *pvVar7;
  undefined4 *puVar8;
  uint *puVar9;
  undefined2 uVar10;
  short sVar11;
  uint uVar12;
  byte bVar13;
  char cVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  char *pcVar18;
  bool bVar19;
  bool bVar20;
  
  pcVar5 = data_ptr;
  pvVar7 = registe_ptr;
  uVar12 = registe_ptr->IP;
  if (10 < (code_ptr[uVar12 + 1] & 0xfU)) {
switchD_00102758_caseD_4:
    puVar8 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar8 = 0xf6;
    __cxa_throw(puVar8,&int::typeinfo,0);
  }
  bVar1 = code_ptr[uVar12 + 2];
  bVar2 = bVar1 >> 4;
  bVar13 = bVar1 & 0xf;
  switch(code_ptr[uVar12 + 1] & 0xfU) {
  case 0:
    bVar3 = (byte)code_ptr[uVar12 + 3] >> 4;
    if (bVar13 != 2) {
      if (bVar13 == 1) {
        puVar9 = register_list[bVar2];
        sVar11 = (short)*register_list[bVar3];
        goto LAB_00102b93;
      }
      if ((bVar1 & 0xf) != 0) goto switchD_00102758_caseD_4;
      cVar14 = (char)*register_list[bVar3];
      *(char *)register_list[bVar2] = cVar14;
LAB_00102a06:
      bVar20 = cVar14 < '\0';
      bVar19 = cVar14 == '\0';
      pvVar7 = registe_ptr;
joined_r0x00102a0c:
      if (!bVar19) {
        if (!bVar19 && !bVar20) {
          pvVar7->flag[0] = '\x01';
          pvVar7->flag[1] = '\x01';
          return 1;
        }
        if (!bVar20) {
          return 1;
        }
        pvVar7->flag[0] = '\x01';
        pvVar7->flag[1] = '\0';
        return 1;
      }
      goto LAB_00102c4c;
    }
    puVar9 = register_list[bVar2];
    uVar12 = *register_list[bVar3];
    break;
  case 1:
    if (bVar13 != 2) {
      if (bVar13 != 1) {
        if ((bVar1 & 0xf) != 0) goto switchD_00102758_caseD_4;
        cVar14 = code_ptr[uVar12 + 3];
        *(char *)register_list[bVar2] = cVar14;
        goto LAB_00102a06;
      }
      sVar11 = *(short *)(code_ptr + (ulong)uVar12 + 3);
      puVar9 = register_list[bVar2];
LAB_00102b93:
      *(short *)puVar9 = sVar11;
      bVar20 = sVar11 < 0;
      bVar19 = sVar11 == 0;
      goto joined_r0x00102a0c;
    }
    uVar12 = *(uint *)(code_ptr + (ulong)uVar12 + 3);
    puVar9 = register_list[bVar2];
    break;
  case 2:
    bVar3 = (byte)code_ptr[uVar12 + 3] >> 4;
    if (registe_ptr->flag[0xe] == '\x01') {
      data_ptr = stack_ptr;
    }
    if (bVar13 == 2) {
      uVar12 = *(uint *)(data_ptr + *register_list[bVar3]);
LAB_00102b5b:
      puVar9 = register_list[bVar2];
LAB_00102bda:
      *puVar9 = uVar12;
      goto LAB_00102bdc;
    }
    if (bVar13 != 1) {
      if ((bVar1 & 0xf) != 0) goto switchD_00102758_caseD_4;
      cVar14 = data_ptr[*register_list[bVar3]];
LAB_001028da:
      *(char *)register_list[bVar2] = cVar14;
      pvVar7 = registe_ptr;
      goto LAB_00102bdc;
    }
    uVar10 = *(undefined2 *)(data_ptr + *register_list[bVar3]);
    goto LAB_00102aef;
  case 3:
    bVar1 = code_ptr[uVar12 + 3];
    uVar16 = (ulong)(bVar1 >> 4);
    if (registe_ptr->flag[0xe] == '\x01') {
      data_ptr = stack_ptr;
    }
    if ((bVar1 & 0xf) == 2) {
      pcVar6 = (char *)(ulong)*register_list[bVar2];
      pcVar18 = data_ptr;
LAB_00102ca3:
      *(uint *)(pcVar18 + (long)pcVar6) = *register_list[uVar16];
      goto LAB_00102d03;
    }
    if ((bVar1 & 0xf) != 1) {
      if ((bVar1 & 0xf) != 0) goto switchD_00102758_caseD_4;
      pcVar6 = (char *)(ulong)*register_list[bVar2];
      pcVar18 = data_ptr;
LAB_00102a8c:
      pcVar18[(long)pcVar6] = (char)*register_list[uVar16];
      pvVar7 = registe_ptr;
      goto LAB_00102d03;
    }
    pcVar6 = (char *)(ulong)*register_list[bVar2];
    pcVar18 = data_ptr;
    goto LAB_00102c73;
  default:
    goto switchD_00102758_caseD_4;
  case 7:
    bVar3 = (byte)code_ptr[uVar12 + 3] >> 4;
    iVar17 = (int)*(short *)(code_ptr + (ulong)uVar12 + 5);
    if (registe_ptr->flag[0xe] == '\x01') {
      data_ptr = stack_ptr;
    }
    if (bVar13 == 2) {
      uVar12 = *(uint *)(data_ptr + (ulong)*register_list[bVar3] + (long)iVar17);
      goto LAB_00102b5b;
    }
    if (bVar13 != 1) {
      if ((bVar1 & 0xf) != 0) goto switchD_00102758_caseD_4;
      cVar14 = data_ptr[iVar17 + *register_list[bVar3]];
      goto LAB_001028da;
    }
    uVar10 = *(undefined2 *)(data_ptr + (ulong)*register_list[bVar3] + (long)iVar17);
LAB_00102aef:
    puVar9 = register_list[bVar2];
LAB_00102b23:
    *(undefined2 *)puVar9 = uVar10;
LAB_00102bdc:
    if (pvVar7->flag[0xe] == '\x01') {
      data_ptr = pcVar5;
    }
    return 1;
  case 8:
    bVar1 = code_ptr[uVar12 + 6];
    bVar13 = bVar1 >> 4;
    lVar15 = (long)*(short *)(code_ptr + (ulong)uVar12 + 4);
    if (registe_ptr->flag[0xe] == '\x01') {
      data_ptr = stack_ptr;
    }
    if ((bVar1 & 0xf) == 2) {
      *(uint *)(data_ptr + (ulong)*register_list[bVar2] + lVar15) = *register_list[bVar13];
    }
    else if ((bVar1 & 0xf) == 1) {
      *(short *)(data_ptr + (ulong)*register_list[bVar2] + lVar15) = (short)*register_list[bVar13];
    }
    else {
      if ((bVar1 & 0xf) != 0) {
        return 1;
      }
      data_ptr[(ulong)*register_list[bVar2] + lVar15] = (char)*register_list[bVar13];
      pvVar7 = registe_ptr;
    }
    goto LAB_00102d03;
  case 9:
    bVar13 = (byte)code_ptr[uVar12 + 3] >> 4;
    bVar1 = code_ptr[uVar12 + 4];
    uVar16 = (ulong)(bVar1 >> 4);
    if (registe_ptr->flag[0xe] == '\x01') {
      data_ptr = stack_ptr;
    }
    if ((bVar1 & 0xf) == 2) {
      pcVar6 = data_ptr + *register_list[bVar2];
      pcVar18 = (char *)(ulong)*register_list[bVar13];
      goto LAB_00102ca3;
    }
    if ((bVar1 & 0xf) != 1) {
      if ((bVar1 & 0xf) != 0) goto switchD_00102758_caseD_4;
      pcVar6 = data_ptr + *register_list[bVar2];
      pcVar18 = (char *)(ulong)*register_list[bVar13];
      goto LAB_00102a8c;
    }
    pcVar6 = data_ptr + *register_list[bVar2];
    pcVar18 = (char *)(ulong)*register_list[bVar13];
LAB_00102c73:
    *(short *)(pcVar18 + (long)pcVar6) = (short)*register_list[uVar16];
LAB_00102d03:
    if (pvVar7->flag[0xe] != '\x01') {
      return 1;
    }
    data_ptr = pcVar5;
    return 1;
  case 10:
    bVar3 = (byte)code_ptr[uVar12 + 3] >> 4;
    bVar4 = (byte)code_ptr[uVar12 + 4] >> 4;
    if (registe_ptr->flag[0xe] == '\x01') {
      data_ptr = stack_ptr;
    }
    if (bVar13 == 2) {
      puVar9 = register_list[bVar2];
      uVar12 = *(uint *)(data_ptr + (ulong)*register_list[bVar3] + (ulong)*register_list[bVar4]);
      goto LAB_00102bda;
    }
    if (bVar13 != 1) {
      if ((bVar1 & 0xf) != 0) goto switchD_00102758_caseD_4;
      *(char *)register_list[bVar2] =
           data_ptr[(ulong)*register_list[bVar3] + (ulong)*register_list[bVar4]];
      pvVar7 = registe_ptr;
      goto LAB_00102bdc;
    }
    puVar9 = register_list[bVar2];
    uVar10 = *(undefined2 *)(data_ptr + (ulong)*register_list[bVar3] + (ulong)*register_list[bVar4])
    ;
    goto LAB_00102b23;
  }
  *puVar9 = uVar12;
  if (uVar12 != 0) {
    pvVar7->flag[0] = '\x01';
    if (0 < (int)uVar12) {
      pvVar7->flag[1] = '\x01';
      return 1;
    }
    pvVar7->flag[1] = '\0';
    return 1;
  }
LAB_00102c4c:
  pvVar7->flag[0] = '\0';
  return 1;
}

Assistant:

int do_mov() {
	uint8_t high = (uint8_t)code_ptr[registe_ptr->IP + 2] / 0x10;
	uint8_t low= (uint8_t)code_ptr[registe_ptr->IP + 2] % 0x10;

	uint8_t o_low = (uint8_t)code_ptr[registe_ptr->IP + 1] % 0x10;

	switch (o_low)//操作类型
	{
	case '\x00': {//mov R,R  ---->0
		//
		uint8_t highb = (uint8_t)(code_ptr[registe_ptr->IP + 3]) / 0x10;
		if (low == 0) {
			char*Ra = (char *)register_list[high];
			char*Rb = (char*)register_list[highb];
			*Ra = *Rb;
			set_flag(*Ra);
			break;
		}
		else if (low == 1)
		{
			int16_t*Ra = (int16_t *)register_list[high];
			int16_t*Rb = (int16_t *)register_list[highb];
			*Ra = *Rb;
			set_flag(*Ra);
			break;
		}
		else if (low == 2)
		{
			unsigned*Ra = (unsigned *)register_list[high];
			unsigned*Rb = (unsigned*)register_list[highb];
			*Ra = *Rb;
			set_flag(*Ra);
			break;
		}
		else throw(LVM_EXECUTE_ERROR);
		break;
	}
	case '\x01': {//mov R,i   ----->1
		if (low == 0)//低位运算
		{
			unsigned temp = code_ptr[registe_ptr->IP + 2 + 1];//获得立即数
			char *R = (char *)register_list[high];
			*R = temp;
			set_flag(*R);
			break;
		}
		else if (low == 1)//高位运算
		{
			unsigned temp = *(short*)(code_ptr + registe_ptr->IP + 2 + 1);//获得立即数
			int16_t *R = (int16_t *)register_list[high];
			*R = temp;
			set_flag(*R);
			break;
		}
		else if (low == 2)//全运算
		{
			unsigned temp = *(unsigned*)(code_ptr + registe_ptr->IP + 2 + 1);//获得立即数
			unsigned *R = (unsigned *)register_list[high];
			*R = temp;
			set_flag(*R);
			break;
		}
		else throw(LVM_EXECUTE_ERROR);
		break;
	}
	case '\x02': {//R,[R] ----->2
		uint8_t highb = (uint8_t)code_ptr[registe_ptr->IP + 3] / 0x10;
		char *data_temp_p = data_ptr;
		if (registe_ptr->flag[14] == 1) data_ptr = stack_ptr;//操控栈段
		if (low == 0)//低位运算
		{
			unsigned value = *(unsigned*)register_list[highb];//获得Rb寄存器中的值
			char temp = data_ptr[value];//获取数据段的内容
			char *R = (char *)register_list[high];
			*R = temp;
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else if (low == 1)//高位运算
		{
			unsigned value = *(unsigned*)register_list[highb];//获得Rb寄存器中的值
			int16_t temp = *(int16_t*)(data_ptr + value);//获取数据段的内容
			int16_t *R = (int16_t *)register_list[high];
			*R = temp;
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else if (low == 2)//全运算
		{
			unsigned value = *(unsigned*)register_list[highb];//获得Rb寄存器中的值
			unsigned temp = *(unsigned*)(data_ptr + value);//获取数据段的内容
			unsigned *R = (unsigned *)register_list[high];
			*R = temp;
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else throw(LVM_EXECUTE_ERROR);
		break;
	}
	case '\x03': {//[R],R----->3
		uint8_t lowb = (uint8_t)code_ptr[registe_ptr->IP + 3] % 0x10;
		uint8_t highb = (uint8_t)code_ptr[registe_ptr->IP + 3] / 0x10;
		char *data_temp_p = data_ptr;
		if (registe_ptr->flag[14] == 1) data_ptr = stack_ptr;//操控栈段
		if (lowb == 0)//低位运算
		{
			unsigned value = *(unsigned*)register_list[high];//获得Ra寄存器中的值
			char *temp = data_ptr + value;//获取数据指针
			char *R = (char *)register_list[highb];//获得Rb寄存器中的值
			*temp = *R;//写入
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else if (lowb == 1)//高位运算
		{
			unsigned value = *(unsigned*)register_list[high];//获得Ra寄存器中的值
			int16_t *temp = (int16_t*)(data_ptr + value);//获取数据指针
			int16_t *R = (int16_t*)register_list[highb];//获得Rb寄存器中的值
			*temp = *R;//写入
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else if (lowb == 2)//全运算
		{
			unsigned value = *(unsigned*)register_list[high];//获得Ra寄存器中的值
			unsigned *temp = (unsigned*)(data_ptr + value);//获取数据指针
			unsigned *R = (unsigned*)register_list[highb];//获得Rb寄存器中的值
			*temp = *R;//写入
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else throw(LVM_EXECUTE_ERROR);
		break;
	}
	case '\x07': {//R, [R + i]----->07
		uint8_t highb = (uint8_t)code_ptr[registe_ptr->IP + 3] / 0x10;
		short i = *(short*)(code_ptr + registe_ptr->IP + 5);//获取立即数

		char *data_temp_p = data_ptr;
		if (registe_ptr->flag[14] == 1) data_ptr = stack_ptr;//操控栈段
		if (low == 0)//低位运算
		{
			unsigned value = *(unsigned*)register_list[highb];//获得Rb寄存器中的值
			char temp = data_ptr[i + value];//获取数据段的内容
			char *R = (char *)register_list[high];
			*R = temp;
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else if (low == 1)//高位运算
		{
			unsigned value = *(unsigned*)register_list[highb];//获得Rb寄存器中的值
			int16_t temp = *(int16_t*)(data_ptr + i + value);//获取数据段的内容
			int16_t *R = (int16_t *)register_list[high];
			*R = temp;
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else if (low == 2)//全运算
		{
			unsigned value = *(unsigned*)register_list[highb];//获得Rb寄存器中的值
			unsigned temp = *(unsigned*)(data_ptr + i + value);//获取数据段的内容
			unsigned *R = (unsigned *)register_list[high];
			*R = temp;
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else throw(LVM_EXECUTE_ERROR);
		break;
	}
	case '\x08': {//[R+i],R----->08
		uint8_t lowb = (uint8_t)code_ptr[registe_ptr->IP + 6] % 0x10;
		uint8_t highb = (uint8_t)code_ptr[registe_ptr->IP + 6] / 0x10;
		short i = *(short*)(code_ptr + registe_ptr->IP + 4);//获取立即数

		char *data_temp_p = data_ptr;
		if (registe_ptr->flag[14] == 1) data_ptr = stack_ptr;//操控栈段
		if (lowb == 0)//低位运算
		{
			unsigned value = *(unsigned*)register_list[high];//获得Ra寄存器中的值
			char *temp = data_ptr + i + value;//获取数据指针
			char *R = (char *)register_list[highb];//获得Rb寄存器中的值
			*temp = *R;//写入
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else if (lowb == 1)//高位运算
		{
			unsigned value = *(unsigned*)register_list[high];//获得Ra寄存器中的值
			int16_t *temp = (int16_t*)(data_ptr + i + value);//获取数据指针
			int16_t *R = (int16_t*)register_list[highb];//获得Rb寄存器中的值
			*temp = *R;//写入
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else if (lowb == 2)//全运算
		{
			unsigned value = *(unsigned*)register_list[high];//获得Ra寄存器中的值
			unsigned *temp = (unsigned*)(data_ptr + i + value);//获取数据指针
			unsigned *R = (unsigned*)register_list[highb];//获得Rb寄存器中的值
			*temp = *R;//写入
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		break;
	}
	case'\x09': {//mov [R+R],R----->09
		uint8_t lowb1 = (uint8_t)code_ptr[registe_ptr->IP + 3] % 0x10;
		uint8_t highb1 = (uint8_t)code_ptr[registe_ptr->IP + 3] / 0x10;
		uint8_t lowb = (uint8_t)code_ptr[registe_ptr->IP + 4] % 0x10;
		uint8_t highb = (uint8_t)code_ptr[registe_ptr->IP + 4] / 0x10;
		char *data_temp_p = data_ptr;
		if (registe_ptr->flag[14] == 1) data_ptr = stack_ptr;//操控栈段
		if (lowb == 0)//低位运算
		{
			unsigned value = *(unsigned*)register_list[high];//获得Ra寄存器中的值
			unsigned value1 = *(unsigned*)register_list[highb1];//获得Ra1寄存器中的值
			char *temp = data_ptr + value + value1;//获取数据指针
			char *R = (char *)register_list[highb];//获得Rb寄存器中的值
			*temp = *R;//写入
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else if (lowb == 1)//高位运算
		{
			unsigned value = *(unsigned*)register_list[high];//获得Ra寄存器中的值
			unsigned value1 = *(unsigned*)register_list[highb1];//获得Ra1寄存器中的值
			int16_t *temp = (int16_t*)(data_ptr + value + value1);//获取数据指针
			int16_t *R = (int16_t*)register_list[highb];//获得Rb寄存器中的值
			*temp = *R;//写入
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else if (lowb == 2)//全运算
		{
			unsigned value = *(unsigned*)register_list[high];//获得Ra寄存器中的值
			unsigned value1 = *(unsigned*)register_list[highb1];//获得Ra1寄存器中的值
			unsigned *temp = (unsigned*)(data_ptr + value + value1);//获取数据指针
			unsigned *R = (unsigned*)register_list[highb];//获得Rb寄存器中的值
			*temp = *R;//写入
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else throw(LVM_EXECUTE_ERROR);
		break;
	}
	case '\x0a': {//mov R,[R+R]----->0a
		uint8_t lowb1 = (uint8_t)code_ptr[registe_ptr->IP + 3] % 0x10;
		uint8_t highb1 = (uint8_t)code_ptr[registe_ptr->IP + 3] / 0x10;
		uint8_t lowb = (uint8_t)code_ptr[registe_ptr->IP + 4] % 0x10;
		uint8_t highb = (uint8_t)code_ptr[registe_ptr->IP + 4] / 0x10;
		char *data_temp_p = data_ptr;
		if (registe_ptr->flag[14] == 1) data_ptr = stack_ptr;//操控栈段
		if (low == 0)//低位运算
		{
			unsigned value = *(unsigned*)register_list[highb];//获得Ra寄存器中的值
			unsigned value1 = *(unsigned*)register_list[highb1];//获得Ra1寄存器中的值
			char *temp = data_ptr + value + value1;//获取数据指针
			char *R = (char *)register_list[high];//获得Rb寄存器中的值
			*R = *temp;//写入
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else if (low == 1)//高位运算
		{
			unsigned value = *(unsigned*)register_list[highb];//获得Ra寄存器中的值
			unsigned value1 = *(unsigned*)register_list[highb1];//获得Ra1寄存器中的值
			int16_t *temp = (int16_t*)(data_ptr + value + value1);//获取数据指针
			int16_t *R = (int16_t*)register_list[high];//获得Rb寄存器中的值
			*R = *temp;//写入
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else if (low == 2)//全运算
		{
			unsigned value = *(unsigned*)register_list[highb];//获得Ra寄存器中的值
			unsigned value1 = *(unsigned*)register_list[highb1];//获得Ra1寄存器中的值
			unsigned *temp = (unsigned*)(data_ptr + value + value1);//获取数据指针
			unsigned *R = (unsigned*)register_list[high];//获得Rb寄存器中的值
			*R = *temp;//写入
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}

	}
	default: {
		throw(LVM_EXECUTE_ERROR);
		break;
	}
	}
	return LVM_SUCCESS;

}